

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type_info.hpp
# Opt level: O2

value * lightconf::value_type_info<std::vector<permission,_std::allocator<permission>_>_>::
        create_value(value *__return_storage_ptr__,
                    vector<permission,_std::allocator<permission>_> *x)

{
  pointer ppVar1;
  pointer ppVar2;
  value_vector_type inner_vals;
  value local_c0;
  
  ppVar1 = (x->super__Vector_base<permission,_std::allocator<permission>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (ppVar2 = (x->super__Vector_base<permission,_std::allocator<permission>_>)._M_impl.
                super__Vector_impl_data._M_start; ppVar2 != ppVar1; ppVar2 = ppVar2 + 1) {
    value_type_info<permission>::create_value(READ);
    std::vector<lightconf::value,_std::allocator<lightconf::value>_>::emplace_back<lightconf::value>
              ((vector<lightconf::value,_std::allocator<lightconf::value>_> *)
               &stack0xffffffffffffff28,&local_c0);
    value::~value(&local_c0);
  }
  value::value(__return_storage_ptr__,(value_vector_type *)&stack0xffffffffffffff28);
  std::vector<lightconf::value,_std::allocator<lightconf::value>_>::~vector
            ((vector<lightconf::value,_std::allocator<lightconf::value>_> *)&stack0xffffffffffffff28
            );
  return __return_storage_ptr__;
}

Assistant:

static value create_value(const std::vector<U>& x) {
        value_vector_type inner_vals;
        for (const auto& u : x) {
            inner_vals.push_back(value_type_info<U>::create_value(u));
        }
        return value(inner_vals);
    }